

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

string * __thiscall
deqp::gls::BuiltinPrecisionTests::intervalToString<tcu::Matrix<float,2,3>>
          (string *__return_storage_ptr__,BuiltinPrecisionTests *this,FloatFormat *fmt,IVal *ival)

{
  ostringstream local_198 [8];
  ostringstream oss;
  IVal *ival_local;
  FloatFormat *fmt_local;
  
  oss._368_8_ = fmt;
  std::__cxx11::ostringstream::ostringstream(local_198);
  printIVal<tcu::Matrix<float,2,3>>((FloatFormat *)this,(IVal *)oss._368_8_,(ostream *)local_198);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

string intervalToString (const FloatFormat& fmt, const typename Traits<T>::IVal& ival)
{
	ostringstream oss;
	printIVal<T>(fmt, ival, oss);
	return oss.str();
}